

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O2

string * google::protobuf::compiler::java::FirstLineOf(string *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,10);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  }
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      '{')) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FirstLineOf(const std::string& value) {
  std::string result = value;

  std::string::size_type pos = result.find_first_of('\n');
  if (pos != std::string::npos) {
    result.erase(pos);
  }

  // If line ends in an opening brace, make it "{ ... }" so it looks nice.
  if (!result.empty() && result[result.size() - 1] == '{') {
    result.append(" ... }");
  }

  return result;
}